

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O1

Vec_Bit_t * Ree_CollectInsiders(Gia_Man_t *pGia,Vec_Int_t *vAdds)

{
  size_t __n;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Vec_Bit_t *vVisited;
  int *piVar4;
  Vec_Bit_t *vInsiders;
  int *piVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  
  iVar6 = ((pGia->nObjs >> 5) + 1) - (uint)((pGia->nObjs & 0x1fU) == 0);
  vVisited = (Vec_Bit_t *)malloc(0x10);
  vVisited->nSize = 0;
  iVar7 = iVar6 * 0x20;
  vVisited->nCap = iVar7;
  if (iVar6 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar6 * 4);
  }
  vVisited->pArray = piVar4;
  vVisited->nSize = iVar7;
  __n = (long)iVar6 * 4;
  piVar5 = (int *)0x0;
  memset(piVar4,0,__n);
  vInsiders = (Vec_Bit_t *)malloc(0x10);
  vInsiders->nSize = 0;
  vInsiders->nCap = iVar7;
  if (iVar6 != 0) {
    piVar5 = (int *)malloc(__n);
  }
  vInsiders->pArray = piVar5;
  vInsiders->nSize = iVar7;
  memset(piVar5,0,__n);
  iVar6 = vAdds->nSize;
  if (0 < iVar6) {
    uVar8 = 4;
    do {
      if (iVar6 <= (int)(uVar8 - 2)) {
LAB_00667164:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar4 = vAdds->pArray;
      uVar1 = piVar4[uVar8 - 2];
      if (uVar1 != 0) {
        if (iVar6 <= (int)(uVar8 - 3)) goto LAB_00667164;
        uVar2 = piVar4[uVar8 - 4];
        if (((int)uVar2 < 0) || (vVisited->nSize <= (int)uVar2)) {
LAB_00667145:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                        ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
        }
        uVar3 = piVar4[uVar8 - 3];
        piVar5 = vVisited->pArray;
        piVar5[uVar2 >> 5] = piVar5[uVar2 >> 5] | 1 << ((byte)uVar2 & 0x1f);
        if (((int)uVar3 < 0) ||
           (((vVisited->nSize <= (int)uVar3 ||
             (piVar5[uVar3 >> 5] = piVar5[uVar3 >> 5] | 1 << ((byte)uVar3 & 0x1f), (int)uVar1 < 0))
            || (vVisited->nSize <= (int)uVar1)))) goto LAB_00667145;
        piVar5[uVar1 >> 5] = piVar5[uVar1 >> 5] | 1 << ((byte)uVar1 & 0x1f);
        if ((vAdds->nSize <= (int)(uVar8 - 1)) || (vAdds->nSize <= (int)uVar8)) goto LAB_00667164;
        iVar6 = piVar4[uVar8];
        Ree_CollectInsiders_rec(pGia,piVar4[uVar8 - 1],vVisited,vInsiders);
        Ree_CollectInsiders_rec(pGia,iVar6,vVisited,vInsiders);
      }
      iVar6 = vAdds->nSize;
      iVar7 = uVar8 + 2;
      uVar8 = uVar8 + 6;
    } while (iVar7 < iVar6);
  }
  if (vVisited->pArray != (int *)0x0) {
    free(vVisited->pArray);
    vVisited->pArray = (int *)0x0;
  }
  free(vVisited);
  return vInsiders;
}

Assistant:

Vec_Bit_t * Ree_CollectInsiders( Gia_Man_t * pGia, Vec_Int_t * vAdds )
{
    Vec_Bit_t * vVisited = Vec_BitStart( Gia_ManObjNum(pGia) );
    Vec_Bit_t * vInsiders = Vec_BitStart( Gia_ManObjNum(pGia) );
    int i, Entry1, Entry2, Entry3;
    for ( i = 0; 6*i < Vec_IntSize(vAdds); i++ )
    {
        if ( Vec_IntEntry(vAdds, 6*i+2) == 0 ) // HADD
            continue;
        // mark inputs
        Entry1 = Vec_IntEntry( vAdds, 6*i + 0 );
        Entry2 = Vec_IntEntry( vAdds, 6*i + 1 );
        Entry3 = Vec_IntEntry( vAdds, 6*i + 2 );
        Vec_BitWriteEntry( vVisited, Entry1, 1 );
        Vec_BitWriteEntry( vVisited, Entry2, 1 );
        Vec_BitWriteEntry( vVisited, Entry3, 1 );
        // traverse from outputs
        Entry1 = Vec_IntEntry( vAdds, 6*i + 3 );
        Entry2 = Vec_IntEntry( vAdds, 6*i + 4 );
        Ree_CollectInsiders_rec( pGia, Entry1, vVisited, vInsiders );
        Ree_CollectInsiders_rec( pGia, Entry2, vVisited, vInsiders );
    }
    Vec_BitFree( vVisited );
    return vInsiders;
}